

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int LogLuvDecode24(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  uint8_t *puVar1;
  long lVar2;
  undefined6 in_register_0000000a;
  uint8_t *puVar3;
  long lVar4;
  tmsize_t tVar5;
  byte *pbVar6;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x10e,"int LogLuvDecode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar1 = tif->tif_data;
  if (puVar1 != (uint8_t *)0x0) {
    lVar2 = occ / (long)*(int *)(puVar1 + 0xc);
    puVar3 = op;
    if (*(int *)(puVar1 + 4) != 2) {
      if (*(long *)(puVar1 + 0x18) < lVar2) {
        TIFFErrorExtR(tif,"LogLuvDecode24","Translation buffer too short");
        return 0;
      }
      puVar3 = *(uint8_t **)(puVar1 + 0x10);
    }
    pbVar6 = tif->tif_rawcp;
    lVar4 = 0;
    for (tVar5 = tif->tif_rawcc; (lVar4 < lVar2 && (2 < tVar5)); tVar5 = tVar5 + -3) {
      *(uint *)(puVar3 + lVar4 * 4) = (uint)pbVar6[2] | (uint)pbVar6[1] << 8 | (uint)*pbVar6 << 0x10
      ;
      pbVar6 = pbVar6 + 3;
      lVar4 = lVar4 + 1;
    }
    tif->tif_rawcp = pbVar6;
    tif->tif_rawcc = tVar5;
    lVar4 = lVar2 - lVar4;
    if (lVar4 != 0) {
      TIFFErrorExtR(tif,"LogLuvDecode24","Not enough data at row %u (short %ld pixels)",
                    (ulong)tif->tif_row,lVar4);
    }
    else {
      (**(code **)(puVar1 + 0x20))(puVar1,op,lVar2);
    }
    return (uint)(lVar4 == 0);
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                ,0x10f,"int LogLuvDecode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
}

Assistant:

static int LogLuvDecode24(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogLuvDecode24";
    LogLuvState *sp = DecoderState(tif);
    tmsize_t cc;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    uint32_t *tp;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (uint32_t *)sp->tbuf;
    }
    /* copy to array of uint32_t */
    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    for (i = 0; i < npixels && cc >= 3; i++)
    {
        tp[i] = bp[0] << 16 | bp[1] << 8 | bp[2];
        bp += 3;
        cc -= 3;
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    if (i != npixels)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at row %" PRIu32
                      " (short %" TIFF_SSIZE_FORMAT " pixels)",
                      tif->tif_row, npixels - i);
        return (0);
    }
    (*sp->tfunc)(sp, op, npixels);
    return (1);
}